

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

Opnd * __thiscall IR::Instr::SetFakeDst(Instr *this,Opnd *newDst)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RegOpnd *pRVar4;
  Opnd *pOVar5;
  
  if (newDst == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x8cb,"(newDst != nullptr)","Calling SetDst with a NULL dst");
    if (!bVar2) goto LAB_00482baf;
    *puVar3 = 0;
  }
  if (this->m_dst != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x8cc,"(this->m_dst == nullptr)",
                       "Calling SetDst without unlinking/freeing the current dst");
    if (!bVar2) goto LAB_00482baf;
    *puVar3 = 0;
  }
  bVar2 = Opnd::IsRegOpnd(newDst);
  if (bVar2) {
    pRVar4 = Opnd::AsRegOpnd(newDst);
    if ((pRVar4->field_0x18 & 0x40) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0x8cd,
                         "(!(newDst->IsRegOpnd() && newDst->AsRegOpnd()->IsSymValueFrozen()))",
                         "!(newDst->IsRegOpnd() && newDst->AsRegOpnd()->IsSymValueFrozen())");
      if (!bVar2) {
LAB_00482baf:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  pOVar5 = Opnd::Use(newDst,this->m_func);
  this->m_dst = pOVar5;
  pOVar5->field_0xb = pOVar5->field_0xb | 0x80;
  return pOVar5;
}

Assistant:

Opnd *
Instr::SetFakeDst(Opnd * newDst)
{
    AssertMsg(newDst != nullptr, "Calling SetDst with a NULL dst");
    AssertMsg(this->m_dst == nullptr, "Calling SetDst without unlinking/freeing the current dst");
    Assert(!(newDst->IsRegOpnd() && newDst->AsRegOpnd()->IsSymValueFrozen()));

    newDst = newDst->Use(m_func);
    this->m_dst = newDst;

#if DBG
    newDst->isFakeDst = true;
#endif
    return newDst;
}